

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

int __thiscall
ExtraData::getArrayHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  pointer *this_00;
  uint flag_00;
  int iVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  int local_130;
  int local_12c;
  int i;
  int index;
  int size;
  int len;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  int local_ec;
  undefined1 local_e8 [4];
  int countOfDimen;
  undefined1 local_a0 [8];
  TypedPropertyValue tmpVal;
  uint flag;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  local_18 = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"              ArrayHeader:          ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"                 Type:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,val);
  Utils::print_vec_from_to(&local_30,0,4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be set to the value obtained by clearing ");
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "the VT_ARRAY (0x2000) bit of this array property\'s PropertyType value."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = &tmpVal.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,val);
  flag_00 = Utils::vectFourBytesToUnsignedInt
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &tmpVal.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::TypedPropertyValue
            ((TypedPropertyValue *)local_a0);
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::TypedPropertyValue
            ((TypedPropertyValue *)local_e8,(TypedPropertyValue *)local_a0);
  parseTypedPropertyValueTypeAndValue(this,false,flag_00,(TypedPropertyValue *)local_e8);
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue
            ((TypedPropertyValue *)local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_108,val);
  iVar1 = Utils::lenFourBytesFromPos(&local_108,4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_108);
  local_ec = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"                 NumDimensions:     ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&size,val);
  iVar1 = Utils::lenFourBytesFromPos((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&size,4)
  ;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&size);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"n unsigned integer representing the number of dimensions ");
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"in the array property. MUST be at least 1 and at most 31.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  index = 8;
  i = 0;
  local_12c = 0;
  for (local_130 = 0; iVar1 = index, local_130 < local_ec; local_130 = local_130 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"                 Dimension ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_130);
    poVar2 = std::operator<<(poVar2,":        ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_148,val);
    i = Utils::lenFourBytesFromPos(&local_148,index);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_148);
    poVar2 = std::operator<<((ostream *)&std::cout,"                   Size:            ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"An unsigned integer representing the size of the dimension.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_160,val);
    local_12c = Utils::lenFourBytesFromPos(&local_160,index + 4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_160);
    poVar2 = std::operator<<((ostream *)&std::cout,"                   IndexOffset:     ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_12c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "A signed integer representing the index offset of the dimension.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (local_12c == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,
                               "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    if (local_12c == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,
                               "An array dimension that is to be accessed with a 0-based index would have the value zero."
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    index = i + index;
  }
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue
            ((TypedPropertyValue *)local_a0);
  return iVar1;
}

Assistant:

int ExtraData::getArrayHeader(std::vector<unsigned int> val) {
    cout << "              ArrayHeader:          " << endl;
    cout << "                 Type:              "; Utils::print_vec_from_to(val, 0, 4);
    cout << Utils::defaultOffsetDocInfo << "MUST be set to the value obtained by clearing " <<
            Utils::defaultOffsetDocInfo << "the VT_ARRAY (0x2000) bit of this array property's PropertyType value." << endl;
        unsigned int flag = Utils::vectFourBytesToUnsignedInt(val, 0);
        ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue tmpVal;
        ExtraData::parseTypedPropertyValueTypeAndValue(false, flag, tmpVal);
    int countOfDimen = Utils::lenFourBytesFromPos(val, 4);
    cout << "                 NumDimensions:     " << Utils::lenFourBytesFromPos(val, 4) << endl;
    cout << Utils::defaultOffsetDocInfo << "n unsigned integer representing the number of dimensions " <<
            Utils::defaultOffsetDocInfo << "in the array property. MUST be at least 1 and at most 31." << endl;
    int len = 8, size = 0, index = 0;
    for(int i = 0; i < countOfDimen; ++i) {
        cout << "                 Dimension " << dec << i << ":        " << endl;
        size = Utils::lenFourBytesFromPos(val, len);
        cout << "                   Size:            " << dec << size << endl <<
            Utils::defaultOffsetDocInfo << "An unsigned integer representing the size of the dimension." << endl;
        index = Utils::lenFourBytesFromPos(val, len + 4);
        cout << "                   IndexOffset:     " << hex << index << endl <<
             Utils::defaultOffsetDocInfo << "A signed integer representing the index offset of the dimension." << endl;
        if(index == 0x00000001)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
            << endl;
        if(index == 0)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 0-based index would have the value zero." << endl;
        len += size;
    }
    return len;
}